

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall CMU462::Matrix3x3::inv(Matrix3x3 *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Matrix3x3 *in_RDI;
  double x;
  double dVar4;
  Matrix3x3 *A;
  Matrix3x3 *B;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  Matrix3x3 *in_stack_fffffffffffffeb0;
  Matrix3x3 *this_00;
  Matrix3x3 *in_stack_fffffffffffffec0;
  double dVar5;
  Matrix3x3 *this_01;
  Matrix3x3 *this_02;
  
  Matrix3x3(in_stack_fffffffffffffec0);
  pdVar3 = operator()(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
  ;
  dVar1 = *pdVar3;
  pdVar3 = operator()(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
  ;
  dVar5 = *pdVar3;
  pdVar3 = operator()(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
  ;
  this_00 = (Matrix3x3 *)*pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  x = -dVar1 * dVar5 + (double)this_00 * *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = x;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar1 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar5 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  this_01 = (Matrix3x3 *)*pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar4 = (double)this_01 * *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = dVar1 * dVar5 + -dVar4;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar1 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar5 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar4 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar2 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = -dVar1 * dVar5 + dVar4 * dVar2;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar1 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar5 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar4 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar2 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = dVar1 * dVar5 + -(dVar4 * dVar2);
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar1 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar5 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  this_02 = (Matrix3x3 *)*pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar4 = (double)this_02 * *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = -dVar1 * dVar5 + dVar4;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar1 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar5 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar4 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar2 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = dVar1 * dVar5 + -(dVar4 * dVar2);
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar1 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar5 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar4 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar2 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = -dVar1 * dVar5 + dVar4 * dVar2;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar1 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar5 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar4 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar2 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = dVar1 * dVar5 + -(dVar4 * dVar2);
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar1 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar5 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar4 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  dVar2 = *pdVar3;
  pdVar3 = operator()(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  *pdVar3 = -dVar1 * dVar5 + dVar4 * dVar2;
  det(this_02);
  operator/=(this_01,x);
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::inv( void ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B(0,0) = -A(1,2)*A(2,1) + A(1,1)*A(2,2); B(0,1) =  A(0,2)*A(2,1) - A(0,1)*A(2,2); B(0,2) = -A(0,2)*A(1,1) + A(0,1)*A(1,2);
    B(1,0) =  A(1,2)*A(2,0) - A(1,0)*A(2,2); B(1,1) = -A(0,2)*A(2,0) + A(0,0)*A(2,2); B(1,2) =  A(0,2)*A(1,0) - A(0,0)*A(1,2);
    B(2,0) = -A(1,1)*A(2,0) + A(1,0)*A(2,1); B(2,1) =  A(0,1)*A(2,0) - A(0,0)*A(2,1); B(2,2) = -A(0,1)*A(1,0) + A(0,0)*A(1,1);

    B /= det();

    return B;
  }